

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

bool cfd::core::ScriptUtil::IsValidRedeemScript(Script *redeem_script)

{
  size_t sVar1;
  size_t script_buf_size;
  size_t local_28;
  CfdSourceLocation local_20;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,
             &(redeem_script->script_data_).data_);
  sVar1 = ByteData::GetDataSize((ByteData *)&local_20);
  if (local_20.filename != (char *)0x0) {
    operator_delete(local_20.filename);
  }
  if (0x208 < sVar1) {
    local_20.filename = "cfdcore_script.cpp";
    local_20.line = 0x5c5;
    local_20.funcname = "IsValidRedeemScript";
    local_28 = sVar1;
    logger::log<unsigned_long&>
              (&local_20,kCfdLogLevelWarning,"Redeem script size is over the limit. script size={}",
               &local_28);
  }
  return sVar1 < 0x209;
}

Assistant:

const ByteData Script::GetData() const { return script_data_; }